

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseCompiler::_newStack
          (BaseCompiler *this,BaseMem *out,uint32_t size,uint32_t alignment,char *name)

{
  uint32_t uVar1;
  Error EVar2;
  VirtReg *in_RAX;
  uint uVar3;
  uint uVar4;
  VirtReg *vReg;
  VirtReg *local_28;
  
  (out->super_Operand).super_Operand_._signature = 2;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  if ((size != 0) && (uVar4 = alignment + (alignment == 0), (uVar4 & uVar4 - 1) == 0)) {
    local_28 = in_RAX;
    EVar2 = newVirtReg(this,&local_28,kVoid,(OperandSignature)0x0,name);
    if (EVar2 == 0) {
      uVar3 = 0x40;
      if (uVar4 < 0x40) {
        uVar3 = uVar4;
      }
      *(uint32_t *)(local_28 + 8) = size;
      local_28[0xf] = (VirtReg)((byte)local_28[0xf] | 2);
      local_28[0xc] = SUB41(uVar3,0);
      uVar1 = *(uint32_t *)(local_28 + 4);
      (out->super_Operand).super_Operand_._signature._bits =
           (this->super_BaseBuilder).super_BaseEmitter._gpSignature._bits & 0xf8 | 0x2002;
      (out->super_Operand).super_Operand_._baseId = uVar1;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
    }
    return EVar2;
  }
  EVar2 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseCompiler::_newStack(BaseMem* out, uint32_t size, uint32_t alignment, const char* name) {
  out->reset();

  if (size == 0)
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment == 0)
    alignment = 1;

  if (!Support::isPowerOf2(alignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment > 64)
    alignment = 64;

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, TypeId::kVoid, OperandSignature{0}, name));
  ASMJIT_ASSUME(vReg != nullptr);

  vReg->_virtSize = size;
  vReg->_isStack = true;
  vReg->_alignment = uint8_t(alignment);

  // Set the memory operand to GPD/GPQ and its id to VirtReg.
  *out = BaseMem(OperandSignature::fromOpType(OperandType::kMem) |
                 OperandSignature::fromMemBaseType(_gpSignature.regType()) |
                 OperandSignature::fromBits(OperandSignature::kMemRegHomeFlag),
                 vReg->id(), 0, 0);
  return kErrorOk;
}